

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O1

StringList * __thiscall
Rml::DataViewText::GetVariableNameList_abi_cxx11_
          (StringList *__return_storage_ptr__,DataViewText *this)

{
  pointer pDVar1;
  code *pcVar2;
  bool bVar3;
  pointer pDVar4;
  StringList entry_list;
  StringList local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__return_storage_ptr__,
            ((long)(this->data_entries).
                   super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->data_entries).
                   super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  pDVar4 = (this->data_entries).
           super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->data_entries).
           super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pDVar4 == pDVar1) {
      return __return_storage_ptr__;
    }
    if (((pDVar4->data_expression)._M_t.
         super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>._M_t.
         super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>.
         super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl == (DataExpression *)0x0)
       && (bVar3 = Assert("RMLUI_ASSERT(entry.data_expression)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                          ,0x1a1), !bVar3)) break;
    DataExpression::GetVariableNameList_abi_cxx11_
              (&local_48,
               (pDVar4->data_expression)._M_t.
               super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
               .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    pDVar4 = pDVar4 + 1;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

StringList DataViewText::GetVariableNameList() const
{
	StringList full_list;
	full_list.reserve(data_entries.size());

	for (const DataEntry& entry : data_entries)
	{
		RMLUI_ASSERT(entry.data_expression);

		StringList entry_list = entry.data_expression->GetVariableNameList();
		full_list.insert(full_list.end(), MakeMoveIterator(entry_list.begin()), MakeMoveIterator(entry_list.end()));
	}

	return full_list;
}